

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::ActiveBuiltinHandler::handle_builtin
          (ActiveBuiltinHandler *this,SPIRType *type,BuiltIn builtin,Bitset *decoration_flags)

{
  bool bVar1;
  bool *pbVar2;
  CompilerError *pCVar3;
  uint *puVar4;
  allocator local_d9;
  string local_d8 [32];
  uint local_b8;
  undefined1 local_b2;
  allocator local_b1;
  uint32_t array_size_1;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [36];
  uint local_64;
  undefined1 local_5d;
  uint32_t array_size;
  allocator local_49;
  string local_48 [32];
  Bitset *local_28;
  Bitset *decoration_flags_local;
  SPIRType *pSStack_18;
  BuiltIn builtin_local;
  SPIRType *type_local;
  ActiveBuiltinHandler *this_local;
  
  local_28 = decoration_flags;
  decoration_flags_local._4_4_ = builtin;
  pSStack_18 = type;
  type_local = (SPIRType *)this;
  if (builtin == BuiltInClipDistance) {
    pbVar2 = VectorView<bool>::operator[](&(type->array_size_literal).super_VectorView<bool>,0);
    if ((*pbVar2 & 1U) == 0) {
      local_5d = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_48,"Array size for ClipDistance must be a literal.",&local_49);
      CompilerError::CompilerError(pCVar3,(string *)local_48);
      local_5d = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar4 = VectorView<unsigned_int>::operator[]
                       (&(pSStack_18->array).super_VectorView<unsigned_int>,0);
    local_64 = *puVar4;
    if (local_64 == 0) {
      local_8a = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_88,"Array size for ClipDistance must not be unsized.",&local_89);
      CompilerError::CompilerError(pCVar3,(string *)local_88);
      local_8a = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this->compiler->clip_distance_count = local_64;
  }
  else if (builtin == BuiltInCullDistance) {
    pbVar2 = VectorView<bool>::operator[](&(type->array_size_literal).super_VectorView<bool>,0);
    if ((*pbVar2 & 1U) == 0) {
      local_b2 = 1;
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&array_size_1,"Array size for CullDistance must be a literal.",&local_b1)
      ;
      CompilerError::CompilerError(pCVar3,(string *)&array_size_1);
      local_b2 = 0;
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    puVar4 = VectorView<unsigned_int>::operator[]
                       (&(pSStack_18->array).super_VectorView<unsigned_int>,0);
    local_b8 = *puVar4;
    if (local_b8 == 0) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_d8,"Array size for CullDistance must not be unsized.",&local_d9);
      CompilerError::CompilerError(pCVar3,(string *)local_d8);
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this->compiler->cull_distance_count = local_b8;
  }
  else if ((builtin == BuiltInPosition) && (bVar1 = Bitset::get(decoration_flags,0x12), bVar1)) {
    this->compiler->position_invariant = true;
  }
  return;
}

Assistant:

void Compiler::ActiveBuiltinHandler::handle_builtin(const SPIRType &type, BuiltIn builtin,
                                                    const Bitset &decoration_flags)
{
	// If used, we will need to explicitly declare a new array size for these builtins.

	if (builtin == BuiltInClipDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for ClipDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for ClipDistance must not be unsized.");
		compiler.clip_distance_count = array_size;
	}
	else if (builtin == BuiltInCullDistance)
	{
		if (!type.array_size_literal[0])
			SPIRV_CROSS_THROW("Array size for CullDistance must be a literal.");
		uint32_t array_size = type.array[0];
		if (array_size == 0)
			SPIRV_CROSS_THROW("Array size for CullDistance must not be unsized.");
		compiler.cull_distance_count = array_size;
	}
	else if (builtin == BuiltInPosition)
	{
		if (decoration_flags.get(DecorationInvariant))
			compiler.position_invariant = true;
	}
}